

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

ecs_type_t ecs_get_type(ecs_world_t *world,ecs_entity_t entity)

{
  long *plVar1;
  ecs_table_t *table;
  ecs_record_t *record;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x98b);
  if (world != (ecs_world_t *)0x0) {
    plVar1 = (long *)_ecs_sparse_get_sparse((world->store).entity_index,0x10,entity);
    if ((plVar1 == (long *)0x0) || ((undefined8 *)*plVar1 == (undefined8 *)0x0)) {
      world_local = (ecs_world_t *)0x0;
    }
    else {
      world_local = *(ecs_world_t **)*plVar1;
    }
    return (ecs_type_t)world_local;
  }
  __assert_fail("world != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x98b,"ecs_type_t ecs_get_type(ecs_world_t *, ecs_entity_t)");
}

Assistant:

ecs_type_t ecs_get_type(
    ecs_world_t *world,
    ecs_entity_t entity)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_record_t *record = NULL;

    record = ecs_eis_get(world, entity);

    ecs_table_t *table;
    if (record && (table = record->table)) {
        return table->type;
    }
    
    return NULL;
}